

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullable.cpp
# Opt level: O0

size_t __thiscall clickhouse::ColumnNullable::Size(ColumnNullable *this)

{
  int iVar1;
  int iVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  element_type *peVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  peVar3 = std::__shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x21282b);
  iVar1 = (*peVar3->_vptr_Column[6])();
  peVar4 = std::
           __shared_ptr_access<clickhouse::ColumnVector<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<clickhouse::ColumnVector<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x212846);
  iVar2 = (*(peVar4->super_Column)._vptr_Column[6])();
  if (CONCAT44(extraout_var,iVar1) == CONCAT44(extraout_var_00,iVar2)) {
    peVar4 = std::
             __shared_ptr_access<clickhouse::ColumnVector<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<clickhouse::ColumnVector<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x21288a);
    iVar1 = (*(peVar4->super_Column)._vptr_Column[6])();
    return CONCAT44(extraout_var_01,iVar1);
  }
  __assert_fail("nested_->Size() == nulls_->Size()",
                "/workspace/llm4binary/github/license_c_cmakelists/artpaul[P]clickhouse-cpp/clickhouse/columns/nullable.cpp"
                ,0x3e,"virtual size_t clickhouse::ColumnNullable::Size() const");
}

Assistant:

size_t ColumnNullable::Size() const {
    assert(nested_->Size() == nulls_->Size());
    return nulls_->Size();
}